

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O3

sz_ssize_t sznet::net::sockets::sz_socket_write(sz_sock sockfd,void *buf,size_t count)

{
  ssize_t sVar1;
  
  sVar1 = send(sockfd,buf,count,0);
  return sVar1;
}

Assistant:

sz_ssize_t sz_socket_write(sz_sock sockfd, const void* buf, size_t count)
{
#ifdef SZ_OS_WINDOWS
	static int maxInt32 = std::numeric_limits<int>::max(); (void)maxInt32;
	if (unlikely(count > maxInt32))
	{
		count = maxInt32;
	}
	return ::send(sockfd, static_cast<const char*>(buf), static_cast<int>(count), 0);
#else
	return ::send(sockfd, static_cast<const char*>(buf), count, 0);
#endif
}